

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void mi_subproc_delete(mi_subproc_id_t subproc_id)

{
  mi_subproc_t *p;
  mi_subproc_id_t in_RDI;
  mi_memid_t in_stack_00000000;
  _Bool _go;
  _Bool safe_to_delete;
  mi_subproc_t *subproc;
  pthread_mutex_t *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffe8;
  char cVar1;
  byte bVar2;
  
  if (in_RDI != (mi_subproc_id_t)0x0) {
    p = _mi_subproc_from_id(in_RDI);
    bVar2 = 0;
    mi_lock_acquire(in_stack_ffffffffffffffd0);
    cVar1 = '\x01';
    while (cVar1 != '\0') {
      if (p->abandoned_os_list == (mi_segment_t *)0x0) {
        bVar2 = 1;
      }
      mi_lock_release((pthread_mutex_t *)0xadf135);
      cVar1 = '\0';
    }
    if ((bVar2 & 1) != 0) {
      mi_lock_done((pthread_mutex_t *)0xadf153);
      mi_lock_done((pthread_mutex_t *)0xadf161);
      _mi_arena_meta_free(p,in_stack_00000000,
                          CONCAT17(bVar2,CONCAT16(cVar1,in_stack_ffffffffffffffe8)));
    }
  }
  return;
}

Assistant:

void mi_subproc_delete(mi_subproc_id_t subproc_id) {
  if (subproc_id == NULL) return;
  mi_subproc_t* subproc = _mi_subproc_from_id(subproc_id);
  // check if there are no abandoned segments still..
  bool safe_to_delete = false;
  mi_lock(&subproc->abandoned_os_lock) {
    if (subproc->abandoned_os_list == NULL) {
      safe_to_delete = true;
    }
  }
  if (!safe_to_delete) return;
  // safe to release
  // todo: should we refcount subprocesses?
  mi_lock_done(&subproc->abandoned_os_lock);
  mi_lock_done(&subproc->abandoned_os_visit_lock);
  _mi_arena_meta_free(subproc, subproc->memid, sizeof(mi_subproc_t));
}